

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::raii_casemap::raii_casemap(raii_casemap *this,string *locale_id)

{
  UCaseMap *pUVar1;
  runtime_error *this_00;
  allocator local_3d;
  UErrorCode err;
  string local_38;
  
  this->map_ = (UCaseMap *)0x0;
  err = U_ZERO_ERROR;
  pUVar1 = (UCaseMap *)ucasemap_open_70((locale_id->_M_dataplus)._M_p,0,&err);
  this->map_ = pUVar1;
  check_and_throw_icu_error(err);
  if (this->map_ != (UCaseMap *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"Failed to create UCaseMap",&local_3d);
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

raii_casemap(std::string const &locale_id) :
            map_(0)
        {
            UErrorCode err=U_ZERO_ERROR;
            map_ = ucasemap_open(locale_id.c_str(),0,&err);
            check_and_throw_icu_error(err);
            if(!map_)
                throw booster::runtime_error("Failed to create UCaseMap");
        }